

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeedPPR.h
# Opt level: O0

void __thiscall
SpeedPPR::WHOLE_GRAPH_STRUCTURE<double>::~WHOLE_GRAPH_STRUCTURE(WHOLE_GRAPH_STRUCTURE<double> *this)

{
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x111ede)
  ;
  MyQueue::~MyQueue((MyQueue *)0x111eec);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

WHOLE_GRAPH_STRUCTURE(const VertexIdType &_numOfVertices) :
                means(_numOfVertices + 2, 0),
                active_vertices(_numOfVertices + 2),
                is_active(_numOfVertices + 2, false),
                pi(_numOfVertices + 2, 0),
                residuals(_numOfVertices + 2, 0) {
        }